

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

void __thiscall
ValidationCache::ValidationCache
          (ValidationCache *this,size_t script_execution_cache_bytes,size_t signature_cache_bytes)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  Logger *pLVar3;
  uint *in_R9;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  pair<unsigned_int,_unsigned_long> pVar4;
  ulong local_110;
  ulong local_108;
  uint local_100 [2];
  ulong local_f8;
  uint256 nonce;
  string local_68;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CSHA256::CSHA256(&this->m_script_execution_cache_hasher);
  CuckooCache::cache<uint256,_SignatureCacheHasher>::cache(&this->m_script_execution_cache);
  SignatureCache::SignatureCache(&this->m_signature_cache,signature_cache_bytes);
  GetRandHash();
  CSHA256::Write(&this->m_script_execution_cache_hasher,(uchar *)&nonce,0x20);
  CSHA256::Write(&this->m_script_execution_cache_hasher,(uchar *)&nonce,0x20);
  pVar4 = CuckooCache::cache<uint256,_SignatureCacheHasher>::setup_bytes
                    (&this->m_script_execution_cache,script_execution_cache_bytes);
  local_f8 = pVar4.second;
  local_100[0] = pVar4.first;
  local_108 = local_f8 >> 0x14;
  local_110 = script_execution_cache_bytes >> 0x14;
  pLVar3 = LogInstance();
  bVar2 = BCLog::Logger::Enabled(pLVar3);
  if (bVar2) {
    log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
    log_msg._M_string_length = 0;
    log_msg.field_2._M_local_buf[0] = '\0';
    tinyformat::format<unsigned_long,unsigned_long,unsigned_int>
              (&local_68,
               (tinyformat *)
               "Using %zu MiB out of %zu MiB requested for script execution cache, able to store %zu elements\n"
               ,(char *)&local_108,&local_110,(unsigned_long *)local_100,in_R9);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&log_msg,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    pLVar3 = LogInstance();
    local_68._M_dataplus._M_p = (pointer)0x57;
    local_68._M_string_length = 0x6d76f9;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
    source_file._M_len = 0x57;
    str._M_str = log_msg._M_dataplus._M_p;
    str._M_len = log_msg._M_string_length;
    logging_function._M_str = "ValidationCache";
    logging_function._M_len = 0xf;
    BCLog::Logger::LogPrintStr(pLVar3,str,logging_function,source_file,0x83f,ALL,Info);
    std::__cxx11::string::~string((string *)&log_msg);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ValidationCache::ValidationCache(const size_t script_execution_cache_bytes, const size_t signature_cache_bytes)
    : m_signature_cache{signature_cache_bytes}
{
    // Setup the salted hasher
    uint256 nonce = GetRandHash();
    // We want the nonce to be 64 bytes long to force the hasher to process
    // this chunk, which makes later hash computations more efficient. We
    // just write our 32-byte entropy twice to fill the 64 bytes.
    m_script_execution_cache_hasher.Write(nonce.begin(), 32);
    m_script_execution_cache_hasher.Write(nonce.begin(), 32);

    const auto [num_elems, approx_size_bytes] = m_script_execution_cache.setup_bytes(script_execution_cache_bytes);
    LogPrintf("Using %zu MiB out of %zu MiB requested for script execution cache, able to store %zu elements\n",
              approx_size_bytes >> 20, script_execution_cache_bytes >> 20, num_elems);
}